

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_beta_encode_int(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  uint uVar1;
  uint local_38;
  int local_34;
  int r;
  int i;
  int *syms;
  int in_size_local;
  char *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  local_38 = 0;
  for (local_34 = 0; local_34 < in_size; local_34 = local_34 + 1) {
    uVar1 = store_bits_MSB(c->out,*(int *)(in + (long)local_34 * 4) + (c->field_6).huffman.ncodes,
                           (c->field_6).beta.nbits);
    local_38 = uVar1 | local_38;
  }
  return local_38;
}

Assistant:

int cram_beta_encode_int(cram_slice *slice, cram_codec *c,
			 char *in, int in_size) {
    int *syms = (int *)in;
    int i, r = 0;

    for (i = 0; i < in_size; i++)
	r |= store_bits_MSB(c->out, syms[i] + c->e_beta.offset,
			    c->e_beta.nbits);

    return r;
}